

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
booster::locale::basic_format<wchar_t>::basic_format
          (basic_format<wchar_t> *this,message_type *trans)

{
  long lVar1;
  
  basic_message<wchar_t>::basic_message(&this->message_,trans);
  (this->format_)._M_dataplus._M_p = (pointer)&(this->format_).field_2;
  (this->format_)._M_string_length = 0;
  (this->format_).field_2._M_local_buf[0] = L'\0';
  this->translate_ = true;
  lVar1 = 0;
  do {
    *(undefined8 *)((long)&this->parameters_[0].pointer_ + lVar1) = 0;
    *(code **)((long)&this->parameters_[0].writer_ + lVar1) =
         details::formattible<wchar_t>::void_write;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x80);
  this->parameters_count_ = 0;
  (this->ext_params_).
  super__Vector_base<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ext_params_).
  super__Vector_base<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ext_params_).
  super__Vector_base<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

basic_format(message_type const &trans) : 
                message_(trans),
                translate_(true),
                parameters_count_(0)
            {
            }